

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

int Llb_Nonlin4Reachability(Llb_Mnx_t *p)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  DdManager *manager;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  DdNode *pDVar12;
  abctime aVar13;
  Abc_Cex_t *pAVar14;
  double dVar15;
  double dVar16;
  double nMints;
  Vec_Ptr_t *vStates;
  abctime clk;
  abctime clkIter;
  abctime clkTemp;
  int nBddSizeTo2;
  int nBddSizeTo;
  int nBddSizeFr;
  int nIters;
  DdNode *bAux;
  Llb_Mnx_t *p_local;
  
  nBddSizeTo2 = 0;
  clkTemp._4_4_ = 0;
  clkTemp._0_4_ = 0;
  bAux = (DdNode *)p;
  vStates = (Vec_Ptr_t *)Abc_Clock();
  iVar9 = Aig_ManRegNum(*(Aig_Man_t **)bAux);
  if (iVar9 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x2a3,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
  }
  if (*(int *)((long)&bAux->next->Id + 4) == 0) {
    if (bAux->next[2].index == 0) {
      if (*(int *)((long)&bAux->next[1].next + 4) == 0) {
        pDVar12 = Llb_Nonlin4ComputeBad
                            ((DdManager *)(bAux->type).kids.T,*(Aig_Man_t **)bAux,
                             (Vec_Int_t *)bAux[1].Id);
        (bAux->type).kids.E = pDVar12;
        if ((bAux->type).kids.E == (DdNode *)0x0) {
          if ((int)bAux->next[1].Id == 0) {
            printf("Reached timeout (%d seconds) during constructing the bad states.\n",
                   (ulong)bAux->next[2].ref);
          }
          *(undefined4 *)((long)&bAux->next[2].type + 8) = 0xffffffff;
          return -1;
        }
        Cudd_Ref((bAux->type).kids.E);
      }
      else {
        (bAux->type).kids.E = (DdNode *)(bAux->type).kids.T[0x12].type.value;
        (bAux->type).kids.T[0x12].type.value = 0.0;
      }
    }
    else if ((bAux->type).kids.T[0x12].type.kids.T != (DdNode *)0x0) {
      Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,(bAux->type).kids.T[0x12].type.kids.T);
      (bAux->type).kids.T[0x12].type.value = 0.0;
    }
    pDVar12 = Llb_Nonlin4ComputeInitState
                        ((DdManager *)(bAux->type).kids.T,*(Aig_Man_t **)bAux,
                         (Vec_Int_t *)bAux[1].Id,*(int *)((long)&bAux->next->Id + 4));
    *(DdNode **)(bAux + 1) = pDVar12;
    Cudd_Ref(*(DdNode **)(bAux + 1));
  }
  else {
    if (bAux->next[2].index == 0) {
      pDVar12 = Llb_Nonlin4ComputeInitState
                          ((DdManager *)(bAux->type).kids.T,*(Aig_Man_t **)bAux,
                           (Vec_Int_t *)bAux[1].Id,*(int *)((long)&bAux->next->Id + 4));
      (bAux->type).kids.E = pDVar12;
      Cudd_Ref((bAux->type).kids.E);
    }
    if (*(int *)((long)&bAux->next[1].next + 4) == 0) {
      pDVar12 = Llb_Nonlin4ComputeBad
                          ((DdManager *)(bAux->type).kids.T,*(Aig_Man_t **)bAux,
                           (Vec_Int_t *)bAux[1].Id);
      *(DdNode **)(bAux + 1) = pDVar12;
      lVar1._0_4_ = bAux[1].index;
      lVar1._4_4_ = bAux[1].ref;
      if (lVar1 == 0) {
        if ((int)bAux->next[1].Id == 0) {
          printf("Reached timeout (%d seconds) during constructing the bad states.\n",
                 (ulong)bAux->next[2].ref);
        }
        *(undefined4 *)((long)&bAux->next[2].type + 8) = 0xffffffff;
        return -1;
      }
      Cudd_Ref(*(DdNode **)(bAux + 1));
    }
    else {
      *(double *)(bAux + 1) = (bAux->type).kids.T[0x12].type.value;
      (bAux->type).kids.T[0x12].type.value = 0.0;
    }
    _nBddSizeFr = *(DdNode **)(bAux + 1);
    pDVar12 = Cudd_bddVarMap((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
    *(DdNode **)(bAux + 1) = pDVar12;
    lVar2._0_4_ = bAux[1].index;
    lVar2._4_4_ = bAux[1].ref;
    if (lVar2 == 0) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached timeout (%d seconds) during remapping bad states.\n",
               (ulong)bAux->next[2].ref);
      }
      Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
      *(undefined4 *)((long)&bAux->next[2].type + 8) = 0xffffffff;
      return -1;
    }
    Cudd_Ref(*(DdNode **)(bAux + 1));
    Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
  }
  bAux->Id = *(ABC_INT64_T *)(bAux + 1);
  Cudd_Ref((DdNode *)bAux->Id);
  for (nBddSizeTo = 0; nBddSizeTo < (int)bAux->next->ref; nBddSizeTo = nBddSizeTo + 1) {
    clk = Abc_Clock();
    if ((bAux->next[2].ref != 0) && (aVar13 = Abc_Clock(), (long)bAux->next[2].type.kids.T < aVar13)
       ) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached timeout (%d seconds) during image computation.\n",(ulong)bAux->next[2].ref);
      }
      *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
      return -1;
    }
    Vec_PtrPush((Vec_Ptr_t *)bAux[1].type.kids.T,*(void **)(bAux + 1));
    Cudd_Ref(*(DdNode **)(bAux + 1));
    if ((bAux->next[2].index == 0) &&
       (iVar9 = Cudd_bddLeq((DdManager *)(bAux->type).kids.T,*(DdNode **)(bAux + 1),
                            (DdNode *)((ulong)(bAux->type).kids.E ^ 1)), iVar9 == 0)) {
      if (*(long *)(*(long *)bAux + 0x198) == 0) {
        nMints = (double)Llb_Nonlin4DeriveCex
                                   ((Llb_Mnx_t *)bAux,*(int *)((long)&bAux->next->Id + 4),
                                    *(int *)((long)&bAux->next[1].type + 8));
        pAVar14 = Llb4_Nonlin4TransformCex
                            (*(Aig_Man_t **)bAux,(Vec_Ptr_t *)nMints,-1,
                             *(int *)((long)&bAux->next[1].type + 8));
        *(Abc_Cex_t **)(*(long *)bAux + 0x198) = pAVar14;
        Vec_PtrFreeP((Vec_Ptr_t **)&nMints);
        if ((int)bAux->next[1].Id == 0) {
          Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                    (ulong)**(uint **)(*(long *)bAux + 0x198),**(undefined8 **)bAux,
                    (ulong)(uint)nBddSizeTo);
          aVar13 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar13 - (long)vStates);
        }
        *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
        return 0;
      }
      __assert_fail("p->pAig->pSeqModel == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                    ,0x2f6,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
    }
    clkIter = Abc_Clock();
    pDVar12 = Llb_Nonlin4Image((DdManager *)(bAux->type).kids.T,(Vec_Ptr_t *)bAux[1].type.kids.E,
                               *(DdNode **)(bAux + 1),*(Vec_Int_t **)(bAux + 2));
    bAux[1].next = pDVar12;
    if (bAux[1].next == (DdNode *)0x0) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached timeout (%d seconds) during image computation in quantification.\n",
               (ulong)bAux->next[2].ref);
      }
      *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
      return -1;
    }
    Cudd_Ref(bAux[1].next);
    aVar13 = Abc_Clock();
    bAux[2].next = (DdNode *)((aVar13 - clkIter) + (long)bAux[2].next);
    clkIter = Abc_Clock();
    _nBddSizeFr = bAux[1].next;
    pDVar12 = Cudd_bddVarMap((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
    bAux[1].next = pDVar12;
    if (bAux[1].next == (DdNode *)0x0) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached timeout (%d seconds) during remapping next states.\n",
               (ulong)bAux->next[2].ref);
      }
      Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
      *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
      return -1;
    }
    Cudd_Ref(bAux[1].next);
    Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
    aVar13 = Abc_Clock();
    bAux[2].type.kids.T = (DdNode *)((aVar13 - clkIter) + (long)bAux[2].type.kids.T);
    if (*(int *)((long)&bAux->next[1].type + 8) != 0) {
      nBddSizeTo2 = Cudd_DagSize(*(DdNode **)(bAux + 1));
      clkTemp._4_4_ = Cudd_DagSize(_nBddSizeFr);
      clkTemp._0_4_ = Cudd_DagSize(bAux[1].next);
    }
    Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,*(DdNode **)(bAux + 1));
    bAux[1].index = 0;
    bAux[1].ref = 0;
    pDVar12 = Cudd_bddAnd((DdManager *)(bAux->type).kids.T,bAux[1].next,(DdNode *)(bAux->Id ^ 1));
    *(DdNode **)(bAux + 1) = pDVar12;
    lVar3._0_4_ = bAux[1].index;
    lVar3._4_4_ = bAux[1].ref;
    if (lVar3 == 0) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
               (ulong)bAux->next[2].ref);
      }
      *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
      return -1;
    }
    Cudd_Ref(*(DdNode **)(bAux + 1));
    Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,bAux[1].next);
    bAux[1].next = (DdNode *)0x0;
    uVar4._0_4_ = bAux[1].index;
    uVar4._4_4_ = bAux[1].ref;
    if (*(int *)(uVar4 & 0xfffffffffffffffe) == 0x7fffffff) break;
    _nBddSizeFr = (DdNode *)bAux->Id;
    pDVar12 = Cudd_bddOr((DdManager *)(bAux->type).kids.T,_nBddSizeFr,*(DdNode **)(bAux + 1));
    bAux->Id = (ABC_INT64_T)pDVar12;
    if (bAux->Id == 0) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
               (ulong)bAux->next[2].ref);
      }
      *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
      Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
      return -1;
    }
    Cudd_Ref((DdNode *)bAux->Id);
    Cudd_RecursiveDeref((DdManager *)(bAux->type).kids.T,_nBddSizeFr);
    if (*(int *)((long)&bAux->next[1].type + 8) != 0) {
      printf("I =%5d : ",(ulong)(uint)nBddSizeTo);
      printf("Fr =%7d  ",(ulong)(uint)nBddSizeTo2);
      printf("ImNs =%7d  ",(ulong)clkTemp._4_4_);
      printf("ImCs =%7d  ",(ulong)(uint)clkTemp);
      uVar10 = Cudd_DagSize((DdNode *)bAux->Id);
      printf("Rea =%7d   ",(ulong)uVar10);
      uVar10 = Cudd_ReadReorderings((DdManager *)(bAux->type).kids.T);
      uVar11 = Cudd_ReadGarbageCollections((DdManager *)(bAux->type).kids.T);
      printf("(%4d %4d)  ",(ulong)uVar10,(ulong)uVar11);
      aVar13 = Abc_Clock();
      Abc_PrintTime(1,"T",aVar13 - clk);
    }
    if (nBddSizeTo == bAux->next->ref - 1) {
      if ((int)bAux->next[1].Id == 0) {
        printf("Reached limit on the number of timeframes (%d).\n",(ulong)bAux->next->ref);
      }
      *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo;
      return -1;
    }
  }
  if (*(int *)((long)&bAux->next[1].type + 8) != 0) {
    manager = (DdManager *)(bAux->type).kids.T;
    pDVar12 = (DdNode *)bAux->Id;
    iVar9 = Saig_ManRegNum(*(Aig_Man_t **)bAux);
    dVar15 = Cudd_CountMinterm(manager,pDVar12,iVar9);
    lVar5._0_4_ = bAux[1].index;
    lVar5._4_4_ = bAux[1].ref;
    if ((lVar5 == 0) ||
       (uVar6._0_4_ = bAux[1].index, uVar6._4_4_ = bAux[1].ref,
       *(int *)(uVar6 & 0xfffffffffffffffe) != 0x7fffffff)) {
      printf("Reachability analysis is stopped after %d frames.\n",(ulong)(uint)nBddSizeTo);
    }
    else {
      printf("Reachability analysis completed after %d frames.\n",(ulong)(uint)nBddSizeTo);
    }
    iVar9 = Saig_ManRegNum(*(Aig_Man_t **)bAux);
    dVar16 = pow(2.0,(double)iVar9);
    printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar15,(dVar15 * 100.0) / dVar16);
    fflush(_stdout);
  }
  lVar7._0_4_ = bAux[1].index;
  lVar7._4_4_ = bAux[1].ref;
  if ((lVar7 == 0) ||
     (uVar8._0_4_ = bAux[1].index, uVar8._4_4_ = bAux[1].ref,
     *(int *)(uVar8 & 0xfffffffffffffffe) != 0x7fffffff)) {
    if ((int)bAux->next[1].Id == 0) {
      printf("Verified only for states reachable in %d frames.  ",(ulong)(uint)nBddSizeTo);
    }
    *(DdHalfWord *)((long)&bAux->next[2].type + 8) = bAux->next->ref;
    p_local._4_4_ = -1;
  }
  else {
    if ((int)bAux->next[1].Id == 0) {
      printf("The miter is proved unreachable after %d iterations.  ",(ulong)(uint)nBddSizeTo);
    }
    if ((int)bAux->next[1].Id == 0) {
      aVar13 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar13 - (long)vStates);
    }
    *(int *)((long)&bAux->next[2].type + 8) = nBddSizeTo + -1;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Llb_Nonlin4Reachability( Llb_Mnx_t * p )
{ 
    DdNode * bAux;
    int nIters, nBddSizeFr = 0, nBddSizeTo = 0, nBddSizeTo2 = 0;
    abctime clkTemp, clkIter, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    if ( p->pPars->fBackward )
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            p->bBad = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bBad );
        }
        // create init state
        if ( p->pPars->fCluster )
            p->bCurrent = p->dd->bFunc, p->dd->bFunc = NULL; 
        else
        {
            p->bCurrent = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
            if ( p->bCurrent == NULL )
            {
                if ( !p->pPars->fSilent )
                    printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                p->pPars->iFrame = -1;
                return -1;
            }
            Cudd_Ref( p->bCurrent );
        }
        // remap into the next states
        p->bCurrent = Cudd_bddVarMap( p->dd, bAux = p->bCurrent );
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping bad states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, bAux );
    }
    else
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            if ( p->pPars->fCluster )
                p->bBad = p->dd->bFunc, p->dd->bFunc = NULL; 
            else
            {
                p->bBad = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
                if ( p->bBad == NULL )
                {
                    if ( !p->pPars->fSilent )
                        printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                    p->pPars->iFrame = -1;
                    return -1;
                }
                Cudd_Ref( p->bBad );
            }
        }
        else if ( p->dd->bFunc )
            Cudd_RecursiveDeref( p->dd, p->dd->bFunc ), p->dd->bFunc = NULL;
        // compute the starting set of states
        p->bCurrent = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bCurrent );
    }
    // perform iterations
    p->bReached = p->bCurrent; Cudd_Ref( p->bReached );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clkIter = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }

        // save the onion ring
        Vec_PtrPush( p->vRings, p->bCurrent );   Cudd_Ref( p->bCurrent );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->dd, p->bCurrent, Cudd_Not(p->bBad) ) ) 
        {
            Vec_Ptr_t * vStates;
            assert( p->pAig->pSeqModel == NULL );
            vStates = Llb_Nonlin4DeriveCex( p, p->pPars->fBackward, p->pPars->fVerbose ); 
            p->pAig->pSeqModel = Llb4_Nonlin4TransformCex( p->pAig, vStates, -1, p->pPars->fVerbose );
            Vec_PtrFreeP( &vStates );
            if ( !p->pPars->fSilent )
            {
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAig->pSeqModel->iPo, p->pAig->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        clkTemp = Abc_Clock();
        p->bNext = Llb_Nonlin4Image( p->dd, p->vRoots, p->bCurrent, p->vVars2Q );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        p->timeImage += Abc_Clock() - clkTemp;

        // remap into current states
        clkTemp = Abc_Clock();
        p->bNext = Cudd_bddVarMap( p->dd, bAux = p->bNext );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping next states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        Cudd_RecursiveDeref( p->dd, bAux );
        p->timeRemap += Abc_Clock() - clkTemp;

        // collect statistics
        if ( p->pPars->fVerbose )
        {
            nBddSizeFr  = Cudd_DagSize( p->bCurrent );
            nBddSizeTo  = Cudd_DagSize( bAux );
            nBddSizeTo2 = Cudd_DagSize( p->bNext );
        }
        Cudd_RecursiveDeref( p->dd, p->bCurrent ); p->bCurrent = NULL;

        // derive new states
        p->bCurrent = Cudd_bddAnd( p->dd, p->bNext, Cudd_Not(p->bReached) );     
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, p->bNext ); p->bNext = NULL;
        if ( Cudd_IsConstant(p->bCurrent) )
            break;
/*
        // reduce BDD size using constrain // Cudd_bddRestrict
        p->bCurrent = Cudd_bddRestrict( p->dd, bAux = p->bCurrent, Cudd_Not(p->bReached) );   
        Cudd_Ref( p->bCurrent );
printf( "Before = %d.  After = %d.\n", Cudd_DagSize(bAux), Cudd_DagSize(p->bCurrent) );
        Cudd_RecursiveDeref( p->dd, bAux );
*/

        // add to the reached set
        p->bReached = Cudd_bddOr( p->dd, bAux = p->bReached, p->bCurrent );                 
        if ( p->bReached == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd, bAux );  
            return -1;
        }
        Cudd_Ref( p->bReached );
        Cudd_RecursiveDeref( p->dd, bAux );  


        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%5d : ",   nIters );
            printf( "Fr =%7d  ",   nBddSizeFr );
            printf( "ImNs =%7d  ", nBddSizeTo );
            printf( "ImCs =%7d  ", nBddSizeTo2 );
            printf( "Rea =%7d   ", Cudd_DagSize(p->bReached) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->dd), Cudd_ReadGarbageCollections(p->dd) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clkIter );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->dd, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->dd, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            return -1;
        }
    }
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->dd, p->bReached, Saig_ManRegNum(p->pAig) );
        if ( p->bCurrent && Cudd_IsConstant(p->bCurrent) )
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        else
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->bCurrent == NULL || !Cudd_IsConstant(p->bCurrent) )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    if ( !p->pPars->fSilent )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}